

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O1

DdNode * cuddAddComposeRecur(DdManager *dd,DdNode *f,DdNode *g,DdNode *proj)

{
  int *piVar1;
  DdHalfWord index;
  uint uVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *g_00;
  uint uVar6;
  DdNode *g_01;
  
  uVar2 = dd->perm[proj->index];
  uVar6 = 0x7fffffff;
  if ((ulong)f->index != 0x7fffffff) {
    uVar6 = dd->perm[f->index];
  }
  if (uVar2 < uVar6) {
    return f;
  }
  pDVar3 = cuddCacheLookup(dd,0x42,f,g,proj);
  if (pDVar3 != (DdNode *)0x0) {
    return pDVar3;
  }
  if (uVar6 == uVar2) {
    pDVar4 = cuddAddIteRecur(dd,g,(f->type).kids.T,(f->type).kids.E);
    if (pDVar4 != (DdNode *)0x0) {
LAB_007ec7ff:
      cuddCacheInsert(dd,0x42,f,g,proj,pDVar4);
      return pDVar4;
    }
  }
  else {
    uVar2 = 0x7fffffff;
    if ((ulong)g->index != 0x7fffffff) {
      uVar2 = dd->perm[g->index];
    }
    pDVar4 = g;
    pDVar3 = f;
    pDVar5 = f;
    if (uVar6 <= uVar2) {
      pDVar3 = (f->type).kids.T;
      pDVar5 = (f->type).kids.E;
      pDVar4 = f;
    }
    g_00 = g;
    g_01 = g;
    if (uVar2 <= uVar6) {
      g_00 = (g->type).kids.T;
      g_01 = (g->type).kids.E;
    }
    index = pDVar4->index;
    pDVar3 = cuddAddComposeRecur(dd,pDVar3,g_00,proj);
    if (pDVar3 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar5 = cuddAddComposeRecur(dd,pDVar5,g_01,proj);
      if (pDVar5 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        pDVar4 = pDVar3;
        if ((pDVar3 == pDVar5) ||
           (pDVar4 = cuddUniqueInter(dd,index,pDVar3,pDVar5), pDVar4 != (DdNode *)0x0)) {
          piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          goto LAB_007ec7ff;
        }
        Cudd_RecursiveDeref(dd,pDVar3);
        pDVar3 = pDVar5;
      }
      Cudd_RecursiveDeref(dd,pDVar3);
    }
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddAddComposeRecur(
  DdManager * dd,
  DdNode * f,
  DdNode * g,
  DdNode * proj)
{
    DdNode *f1, *f0, *g1, *g0, *r, *t, *e;
    unsigned int v, topf, topg, topindex;

    statLine(dd);
    v = dd->perm[proj->index];
    topf = cuddI(dd,f->index);

    /* Terminal case. Subsumes the test for constant f. */
    if (topf > v) return(f);

    /* Check cache. */
    r = cuddCacheLookup(dd,DD_ADD_COMPOSE_RECUR_TAG,f,g,proj);
    if (r != NULL) {
        return(r);
    }

    if (topf == v) {
        /* Compose. */
        f1 = cuddT(f);
        f0 = cuddE(f);
        r = cuddAddIteRecur(dd, g, f1, f0);
        if (r == NULL) return(NULL);
    } else {
        /* Compute cofactors of f and g. Remember the index of the top
        ** variable.
        */
        topg = cuddI(dd,g->index);
        if (topf > topg) {
            topindex = g->index;
            f1 = f0 = f;
        } else {
            topindex = f->index;
            f1 = cuddT(f);
            f0 = cuddE(f);
        }
        if (topg > topf) {
            g1 = g0 = g;
        } else {
            g1 = cuddT(g);
            g0 = cuddE(g);
        }
        /* Recursive step. */
        t = cuddAddComposeRecur(dd, f1, g1, proj);
        if (t == NULL) return(NULL);
        cuddRef(t);
        e = cuddAddComposeRecur(dd, f0, g0, proj);
        if (e == NULL) {
            Cudd_RecursiveDeref(dd, t);
            return(NULL);
        }
        cuddRef(e);

        if (t == e) {
            r = t;
        } else {
            r = cuddUniqueInter(dd, (int) topindex, t, e);
            if (r == NULL) {
                Cudd_RecursiveDeref(dd, t);
                Cudd_RecursiveDeref(dd, e);
                return(NULL);
            }
        }
        cuddDeref(t);
        cuddDeref(e);
    }

    cuddCacheInsert(dd,DD_ADD_COMPOSE_RECUR_TAG,f,g,proj,r);

    return(r);

}